

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O0

void __thiscall
primesieve::Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_>::swap
          (Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *this,
          Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *other)

{
  SievingPrime **ppSVar1;
  SievingPrime **ppSVar2;
  SievingPrime **ppSVar3;
  SievingPrime **tmp_capacity;
  SievingPrime **tmp_end;
  SievingPrime **tmp_array;
  Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *other_local;
  Vector<primesieve::SievingPrime_*,_std::allocator<primesieve::SievingPrime_*>_> *this_local;
  
  ppSVar1 = this->array_;
  ppSVar2 = this->end_;
  ppSVar3 = this->capacity_;
  this->array_ = other->array_;
  this->end_ = other->end_;
  this->capacity_ = other->capacity_;
  other->array_ = ppSVar1;
  other->end_ = ppSVar2;
  other->capacity_ = ppSVar3;
  return;
}

Assistant:

void swap(Vector& other) noexcept
  {
    T* tmp_array = array_;
    T* tmp_end = end_;
    T* tmp_capacity = capacity_;

    array_ = other.array_;
    end_ = other.end_;
    capacity_ = other.capacity_;

    other.array_ = tmp_array;
    other.end_ = tmp_end;
    other.capacity_ = tmp_capacity;
  }